

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPG.h
# Opt level: O2

void __thiscall JPG::~JPG(JPG *this)

{
  ostream *poVar1;
  
  if (this->data != (MCU *)0x0) {
    operator_delete__(this->data);
    this->data = (MCU *)0x0;
    poVar1 = std::operator<<((ostream *)&std::cout,"Delete JPG::Data");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  if (this->blocks != (Block *)0x0) {
    operator_delete__(this->blocks);
    this->blocks = (Block *)0x0;
    poVar1 = std::operator<<((ostream *)&std::cout,"Delete JPG:blocks");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  if (this->BMPData != (YCbCr *)0x0) {
    operator_delete__(this->BMPData);
    this->BMPData = (YCbCr *)0x0;
    poVar1 = std::operator<<((ostream *)&std::cout,"Delete JPG:BMPData");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&(this->huffmanData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
  ;
  std::_Vector_base<Symbol,_std::allocator<Symbol>_>::~_Vector_base
            ((_Vector_base<Symbol,_std::allocator<Symbol>_> *)&this->chromaAC);
  std::_Vector_base<Symbol,_std::allocator<Symbol>_>::~_Vector_base
            ((_Vector_base<Symbol,_std::allocator<Symbol>_> *)&this->chromaDC);
  std::_Vector_base<Symbol,_std::allocator<Symbol>_>::~_Vector_base
            ((_Vector_base<Symbol,_std::allocator<Symbol>_> *)&this->yAC);
  std::_Vector_base<Symbol,_std::allocator<Symbol>_>::~_Vector_base
            ((_Vector_base<Symbol,_std::allocator<Symbol>_> *)this);
  return;
}

Assistant:

~JPG() {
        if(data) {
            delete[] data;
            data = nullptr;
            std::cout << "Delete JPG::Data" << std::endl;
        }
        if(blocks) {
            delete[] blocks;
            blocks = nullptr;
            std::cout << "Delete JPG:blocks" << std::endl;
        }
        if(BMPData) {
            delete[] BMPData;
            BMPData = nullptr;
            std::cout << "Delete JPG:BMPData" << std::endl;
        }
    }